

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# studentGrades.cpp
# Opt level: O1

void printStudentSummary(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *studentScores,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *studentNames)

{
  pointer pbVar1;
  ostream *poVar2;
  ulong uVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  assignmentScores;
  byte local_139;
  double local_138;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_130;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_f0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_110 = studentNames;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,studentScores);
  local_130 = &local_128;
  transpose(local_130,&local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  if ((studentScores->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (studentScores->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      pbVar1 = (local_110->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,pbVar1[uVar7]._M_dataplus._M_p,
                          pbVar1[uVar7]._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Highest score = ",0x10);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_c0,
                 (studentScores->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar7);
      dVar8 = *local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar5 = (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        lVar6 = 0;
        dVar9 = dVar8;
        do {
          dVar8 = local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
          if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6] <= dVar9) {
            dVar8 = dVar9;
          }
          lVar6 = lVar6 + 1;
          dVar9 = dVar8;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
      }
      poVar2 = std::ostream::_M_insert<double>(dVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Lowest score = ",0xf);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_d8,
                 (studentScores->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar7);
      dVar8 = *local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar5 = (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        lVar6 = 0;
        dVar9 = dVar8;
        do {
          dVar8 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
          if (dVar9 <= local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar6]) {
            dVar8 = dVar9;
          }
          lVar6 = lVar6 + 1;
          dVar9 = dVar8;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
      }
      poVar2 = std::ostream::_M_insert<double>(dVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&local_a8,
                 (studentScores->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar7);
      local_138 = mean(&local_a8);
      if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Mean = ",7);
      poVar2 = std::ostream::_M_insert<double>(local_138);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," Grade:",7);
      local_139 = 0x41;
      if (((local_138 < 90.0) && (local_139 = 0x42, local_138 < 80.0)) &&
         (local_139 = 0x43, local_138 < 70.0)) {
        local_139 = (local_138 < 65.0) * '\x02' | 0x44;
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_139,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mean (lowest dropped) = ",0x18);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_60,
                 (studentScores->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar7);
      dVar8 = meanLowestDropped(&local_60);
      poVar2 = std::ostream::_M_insert<double>(dVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"-------------------------------------",0x25);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      uVar7 = uVar7 + 1;
      uVar3 = ((long)(studentScores->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(studentScores->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar7 <= uVar3 && uVar3 - uVar7 != 0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"++++++++++++++++++++++++++++++++++++++++++++",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  uVar7 = 0;
  while (uVar3 = ((long)local_128.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_128.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
        uVar7 <= uVar3 && uVar3 - uVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Assignment: ",0xc);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)(uVar7 + 1));
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Highest score = ",0x10);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_f0,
               local_128.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar7);
    dVar8 = *local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      lVar6 = 0;
      dVar9 = dVar8;
      do {
        dVar8 = local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar6] <= dVar9) {
          dVar8 = dVar9;
        }
        lVar6 = lVar6 + 1;
        dVar9 = dVar8;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Lowest score = ",0xf);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_108,
               local_128.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar7);
    dVar8 = *local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      lVar6 = 0;
      dVar9 = dVar8;
      do {
        dVar8 = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        if (dVar9 <= local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar6]) {
          dVar8 = dVar9;
        }
        lVar6 = lVar6 + 1;
        dVar9 = dVar8;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::vector<double,_std::allocator<double>_>::vector
              (&local_78,
               local_128.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar7);
    local_138 = mean(&local_78);
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Mean = ",7);
    poVar2 = std::ostream::_M_insert<double>(local_138);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," Grade:",7);
    local_139 = 0x41;
    if (((local_138 < 90.0) && (local_139 = 0x42, local_138 < 80.0)) &&
       (local_139 = 0x43, local_138 < 70.0)) {
      local_139 = (local_138 < 65.0) * '\x02' | 0x44;
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_139,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Mean (lowest dropped) = ",0x18);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_90,
               local_128.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar7);
    dVar8 = meanLowestDropped(&local_90);
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_128);
  return;
}

Assistant:

void printStudentSummary(vector<vector<double>> studentScores, vector<string> studentNames) {
    vector<vector<double>> assignmentScores = transpose(studentScores);

    // PRINT STUDENT RESULTS
    for (int i = 0; i < studentScores.size(); i++) {
        cout << studentNames[i] << endl;
        cout << "Highest score = " << max(studentScores[i]) << endl;
        cout << "Lowest score = " << min(studentScores[i]) << endl;
        double grade = mean(studentScores[i]);
        cout << "Mean = " << grade << " Grade:" << gradeLetter(grade) << endl;  // finish gradeletter function.
        cout << "Mean (lowest dropped) = " << meanLowestDropped(studentScores[i]) << endl;
        cout << "-------------------------------------" << endl;
    }

    // PRINT BLANK LINES
    cout << endl;
    cout << endl;
    cout << "++++++++++++++++++++++++++++++++++++++++++++" << endl;
    cout << endl;
    cout << endl;

    // PRINT ASSIGNMENT RESULTS
    for (int i = 0; i < assignmentScores.size(); i++) {
        cout << "Assignment: " << i + 1 << endl;
        cout << "Highest score = " << max(assignmentScores[i]) << endl;
        cout << "Lowest score = " << min(assignmentScores[i]) << endl;
        double grade = mean(assignmentScores[i]);
        cout << "Mean = " << grade << " Grade:" << gradeLetter(grade) <<  endl;  // finish gradeletter function.
        cout << "Mean (lowest dropped) = " << meanLowestDropped(assignmentScores[i]) << endl;
        cout << "-------------------------------------" << endl;
    }
}